

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O3

int __thiscall DTSStreamReader::testSyncInfo16be(DTSStreamReader *this,uint8_t *p_buf)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  this->nblks = (uint)(p_buf[5] >> 2) | (p_buf[4] & 1) << 6;
  uVar4 = p_buf[7] & 0xf;
  bVar1 = p_buf[8];
  iVar3 = (bVar1 >> 6) + 0x10000 + uVar4 * 4;
  if ((p_buf[10] & 6) == 0) {
    iVar3 = (uint)(bVar1 >> 6) + uVar4 * 4;
  }
  iVar2 = 0;
  if ((uint)(p_buf[9] >> 5) + (bVar1 & 3) * 8 == this->pi_bit_rate_index &&
      ((bVar1 >> 2 & 0xf) == this->pi_sample_rate_index && iVar3 == this->pi_audio_mode)) {
    iVar2 = ((uint)p_buf[6] << 4 | (p_buf[5] & 3) << 0xc) + (uint)(p_buf[7] >> 4) + 1;
  }
  return iVar2;
}

Assistant:

int DTSStreamReader::testSyncInfo16be(const uint8_t* p_buf)
{
    nblks = (p_buf[4] & 0x01) << 6 | p_buf[5] >> 2;
    const int frame_size = (p_buf[5] & 0x03) << 12 | p_buf[6] << 4 | p_buf[7] >> 4;
    int test_audio_mode = (p_buf[7] & 0x0f) << 2 | p_buf[8] >> 6;
    const unsigned test_sample_rate_index = (p_buf[8] >> 2) & 0x0f;
    const unsigned test_bit_rate_index = (p_buf[8] & 0x03) << 3 | ((p_buf[9] >> 5) & 0x07);
    const int test_lfe = (p_buf[10] >> 1) & 0x03;
    if (test_lfe)
        test_audio_mode |= 0x10000;
    if (test_audio_mode == pi_audio_mode && test_sample_rate_index == pi_sample_rate_index &&
        test_bit_rate_index == pi_bit_rate_index)
        return frame_size + 1;
    return 0;
}